

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

vm_obj_id_t CVmObjVector::create_fill(int in_root_set,size_t element_count,...)

{
  char *pcVar1;
  char in_AL;
  vm_obj_id_t obj_id;
  CVmObjVector *this;
  void **ppvVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  uint16_t tmp;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar5;
  long lVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  void **local_f0;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[2] = (void *)in_RDX;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,1,0);
  this = (CVmObjVector *)CVmObject::operator_new(0x10,obj_id);
  (this->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_0032eac8;
  alloc_vector(this,element_count);
  pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  local_f0 = &args[0].overflow_arg_area;
  uVar3 = 0x10;
  if (element_count != 0) {
    lVar6 = 4;
    sVar5 = element_count;
    do {
      uVar4 = (ulong)uVar3;
      if (uVar4 < 0x29) {
        uVar3 = uVar3 + 8;
        ppvVar2 = (void **)((long)local_d8 + uVar4);
      }
      else {
        ppvVar2 = local_f0;
        local_f0 = local_f0 + 1;
      }
      vmb_put_dh((this->super_CVmObjCollection).super_CVmObject.ext_ + lVar6,(vm_val_t *)*ppvVar2);
      lVar6 = lVar6 + 5;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  *(short *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2) = (short)element_count;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjVector::create_fill(VMG_ int in_root_set,
                                      size_t element_count, ...)
{
    /* create the object */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, TRUE, FALSE);
    CVmObjVector *vec = new (vmg_ id) CVmObjVector(vmg_ element_count);

    /* populate the elements */
    va_list args;
    va_start(args, element_count);
    for (size_t i = 0 ; i < element_count ; ++i)
    {
        /* get the next value */
        const vm_val_t *val = va_arg(args, const vm_val_t *);

        /* store it */
        vec->set_element(i, val);
    }
    va_end(args);

    /* set the element count */
    vec->set_element_count(element_count);

    /* return the new object's ID */
    return id;
}